

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# untyped_message.cc
# Opt level: O2

Status google::protobuf::json_internal::MakeEndGroupMismatchError
                 (int field_number,int current_group)

{
  uintptr_t in_RDI;
  int local_48;
  int local_44;
  string local_40;
  FormatSpec<int,_int> local_20;
  
  local_20.super_type.spec_.data_ = "attempted to close group %d while inside group %d";
  local_20.super_type.spec_.size_ = 0x31;
  absl::lts_20240722::StrFormat<int,_int>(&local_40,&local_20,&local_44,&local_48);
  absl::lts_20240722::InvalidArgumentError();
  std::__cxx11::string::~string((string *)&local_40);
  return (Status)in_RDI;
}

Assistant:

PROTOBUF_NOINLINE static absl::Status MakeEndGroupMismatchError(
    int field_number, int current_group) {
  return absl::InvalidArgumentError(
      absl::StrFormat("attempted to close group %d while inside group %d",
                      field_number, current_group));
}